

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall
Matrix::CopyRow(Matrix *this,Matrix *source_matrix,int source_row,int destination_row)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Fraction *pFVar4;
  int column;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  bVar3 = false;
  for (lVar5 = 0; lVar5 < this->m_; lVar5 = lVar5 + 1) {
    lVar1 = *(long *)&(this->elements_).
                      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[destination_row].
                      super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                      super__Vector_impl_data;
    pFVar4 = At(source_matrix,source_row,(int)lVar5);
    bVar2 = operator!=((Fraction *)(lVar1 + lVar6),pFVar4);
    if (bVar2) {
      pFVar4 = At(source_matrix,source_row,(int)lVar5);
      *(Fraction *)
       (*(long *)&(this->elements_).
                  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[destination_row].
                  super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                  super__Vector_impl_data + lVar6) = *pFVar4;
      bVar3 = true;
    }
    lVar6 = lVar6 + 8;
  }
  return bVar3;
}

Assistant:

bool Matrix::CopyRow(const Matrix& source_matrix, int source_row, int destination_row) {
  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[destination_row][column] != source_matrix.At(source_row, column)) {
      result = true;
      elements_[destination_row][column] = source_matrix.At(source_row, column);
    }
  }

  return result;
}